

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::processWordHelper(Assembler *this,int value)

{
  iterator iVar1;
  vector<char,std::allocator<char>> *pvVar2;
  char cVar3;
  char lB;
  char hB;
  char local_1a;
  char local_19;
  
  cVar3 = (char)((uint)value >> 8);
  local_1a = (char)value;
  local_19 = cVar3;
  pvVar2 = (vector<char,std::allocator<char>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  iVar1._M_current = *(char **)(pvVar2 + 8);
  if (iVar1._M_current == *(char **)(pvVar2 + 0x10)) {
    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>(pvVar2,iVar1,&local_1a);
  }
  else {
    *iVar1._M_current = (char)value;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 1;
  }
  pvVar2 = (vector<char,std::allocator<char>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  iVar1._M_current = *(char **)(pvVar2 + 8);
  if (iVar1._M_current == *(char **)(pvVar2 + 0x10)) {
    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>(pvVar2,iVar1,&local_19);
  }
  else {
    *iVar1._M_current = cVar3;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 1;
  }
  return;
}

Assistant:

void Assembler::processWordHelper(int value) {


    char hB = (((unsigned) value) >> 8) & 0xFF;
    char lB = ((unsigned) value) & 0xFF;

    codeBySection[currentSectionName].push_back(lB);
    codeBySection[currentSectionName].push_back(hB);
    return;

}